

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall
Diligent::GLContextState::BindUniformBuffer
          (GLContextState *this,Int32 Index,GLBufferObj *Buff,GLintptr Offset,GLsizeiptr Size)

{
  pointer pBVar1;
  pointer pBVar2;
  long lVar3;
  int iVar4;
  Int32 Index_local;
  GLenum err;
  GLintptr local_58;
  string msg;
  
  Index_local = Index;
  if ((Index < 0) || ((this->m_Caps).MaxUniformBufferBindings <= Index)) {
    FormatString<char[37]>(&msg,(char (*) [37])"Uniform buffer index is out of range");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BindUniformBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x165);
    std::__cxx11::string::~string((string *)&msg);
  }
  iVar4 = (Buff->m_UniqueId).m_ID;
  if (iVar4 == 0) {
    LOCK();
    UNLOCK();
    iVar4 = UniqueIdHelper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::GetID()::GlobalCounter
            + 1;
    UniqueIdHelper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::GetID()::GlobalCounter =
         UniqueIdHelper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::GetID()::GlobalCounter +
         1;
    (Buff->m_UniqueId).m_ID = iVar4;
    Index = Index_local;
  }
  pBVar2 = (this->m_BoundUniformBuffers).
           super__Vector_base<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)Index;
  local_58 = Offset;
  if ((int)(((long)(this->m_BoundUniformBuffers).
                   super__Vector_base<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) / 0x18) <= Index) {
    std::
    vector<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
    ::resize(&this->m_BoundUniformBuffers,lVar3 + 1);
    pBVar2 = (this->m_BoundUniformBuffers).
             super__Vector_base<Diligent::GLContextState::BoundBufferInfo,_std::allocator<Diligent::GLContextState::BoundBufferInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pBVar1 = pBVar2 + lVar3;
  if (((pBVar2[lVar3].BufferID != iVar4) || (pBVar1->Offset != local_58)) || (pBVar1->Size != Size))
  {
    pBVar1->BufferID = iVar4;
    pBVar1->Offset = local_58;
    pBVar1->Size = Size;
    (*__glewBindBufferRange)(0x8a11,Index,Buff->m_uiHandle,local_58,Size);
    err = glGetError();
    if (err != 0) {
      LogError<false,char[39],int,char[17],unsigned_int>
                (false,"BindUniformBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x172,(char (*) [39])"Failed to bind uniform buffer to slot ",&Index_local,
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BindUniformBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x172);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return;
}

Assistant:

void GLContextState::BindUniformBuffer(Int32 Index, const GLObjectWrappers::GLBufferObj& Buff, GLintptr Offset, GLsizeiptr Size)
{
    VERIFY(0 <= Index && Index < m_Caps.MaxUniformBufferBindings, "Uniform buffer index is out of range");

    BoundBufferInfo NewUBOInfo{Buff.GetUniqueID(), Offset, Size};
    if (Index >= static_cast<Int32>(m_BoundUniformBuffers.size()))
        m_BoundUniformBuffers.resize(static_cast<size_t>(Index) + 1);

    if (m_BoundUniformBuffers[Index] != NewUBOInfo)
    {
        m_BoundUniformBuffers[Index] = NewUBOInfo;
        GLuint GLBufferHandle        = Buff;
        // In addition to binding buffer to the indexed buffer binding target, glBindBufferBase also binds
        // buffer to the generic buffer binding point specified by target.
        glBindBufferRange(GL_UNIFORM_BUFFER, Index, GLBufferHandle, Offset, Size);
        DEV_CHECK_GL_ERROR("Failed to bind uniform buffer to slot ", Index);
    }
}